

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O1

ostream * amrex::operator<<(ostream *os,Header *hd)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  undefined8 uVar4;
  pointer pdVar5;
  Format FVar6;
  undefined8 in_RAX;
  ostream *poVar7;
  pointer pdVar8;
  RealDescriptor *rd;
  fmtflags __old;
  long lVar9;
  undefined8 uStack_38;
  
  lVar9 = *(long *)os;
  lVar3 = *(long *)(lVar9 + -0x18);
  uVar1 = *(uint *)(os + lVar3 + 0x18);
  *(uint *)(os + lVar3 + 0x18) = uVar1 | 0x100;
  lVar9 = *(long *)(lVar9 + -0x18);
  uVar4 = *(undefined8 *)(os + lVar9 + 8);
  *(undefined8 *)(os + lVar9 + 8) = 0x10;
  uStack_38 = in_RAX;
  poVar7 = (ostream *)std::ostream::operator<<(os,hd->m_vers);
  uStack_38 = CONCAT17(10,(undefined7)uStack_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)((long)&uStack_38 + 7),1);
  poVar7 = (ostream *)std::ostream::operator<<(os,hd->m_how);
  uStack_38 = CONCAT17(10,(undefined7)uStack_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)((long)&uStack_38 + 7),1);
  poVar7 = (ostream *)std::ostream::operator<<(os,hd->m_ncomp);
  uStack_38 = CONCAT17(10,(undefined7)uStack_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)((long)&uStack_38 + 7),1);
  iVar2 = (hd->m_ngrow).vect[0];
  if (((hd->m_ngrow).vect[1] == iVar2) && ((hd->m_ngrow).vect[2] == iVar2)) {
    poVar7 = (ostream *)std::ostream::operator<<(os,iVar2);
  }
  else {
    poVar7 = operator<<(os,&hd->m_ngrow);
  }
  uStack_38 = CONCAT17(10,(undefined7)uStack_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)((long)&uStack_38 + 7),1);
  BoxArray::writeOn(&hd->m_ba,os);
  uStack_38 = CONCAT17(10,(undefined7)uStack_38);
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)((long)&uStack_38 + 7),1);
  operator<<(os,&hd->m_fod);
  uStack_38 = CONCAT17(10,(undefined7)uStack_38);
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)((long)&uStack_38 + 7),1);
  if ((hd->m_vers | 2U) == 3) {
    operator<<(os,&hd->m_min);
    uStack_38 = CONCAT17(10,(undefined7)uStack_38);
    std::__ostream_insert<char,std::char_traits<char>>(os,(char *)((long)&uStack_38 + 7),1);
    operator<<(os,&hd->m_max);
    uStack_38 = CONCAT17(10,(undefined7)uStack_38);
    std::__ostream_insert<char,std::char_traits<char>>(os,(char *)((long)&uStack_38 + 7),1);
  }
  if (hd->m_vers == 4) {
    pdVar8 = (hd->m_famin).super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar5 = (hd->m_famin).super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    if (pdVar5 != pdVar8 && -1 < (long)pdVar5 - (long)pdVar8) {
      lVar9 = 0;
      do {
        poVar7 = std::ostream::_M_insert<double>(pdVar8[lVar9]);
        uStack_38 = CONCAT17(0x2c,(undefined7)uStack_38);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)((long)&uStack_38 + 7),1);
        lVar9 = lVar9 + 1;
        pdVar8 = (hd->m_famin).super_vector<double,_std::allocator<double>_>.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
      } while (lVar9 < (long)(hd->m_famin).super_vector<double,_std::allocator<double>_>.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)pdVar8 >> 3);
    }
    uStack_38 = CONCAT17(10,(undefined7)uStack_38);
    std::__ostream_insert<char,std::char_traits<char>>(os,(char *)((long)&uStack_38 + 7),1);
    pdVar8 = (hd->m_famax).super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar5 = (hd->m_famax).super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    if (pdVar5 != pdVar8 && -1 < (long)pdVar5 - (long)pdVar8) {
      lVar9 = 0;
      do {
        poVar7 = std::ostream::_M_insert<double>(pdVar8[lVar9]);
        uStack_38 = CONCAT17(0x2c,(undefined7)uStack_38);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)((long)&uStack_38 + 7),1);
        lVar9 = lVar9 + 1;
        pdVar8 = (hd->m_famax).super_vector<double,_std::allocator<double>_>.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
      } while (lVar9 < (long)(hd->m_famax).super_vector<double,_std::allocator<double>_>.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)pdVar8 >> 3);
    }
    uStack_38 = CONCAT17(10,(undefined7)uStack_38);
    std::__ostream_insert<char,std::char_traits<char>>(os,(char *)((long)&uStack_38 + 7),1);
  }
  if (hd->m_vers - 2U < 3) {
    FVar6 = FArrayBox::getFormat();
    if (FVar6 == FAB_NATIVE) {
      rd = FPC::NativeRealDescriptor();
    }
    else {
      FVar6 = FArrayBox::getFormat();
      if (FVar6 == FAB_NATIVE_32) {
        rd = FPC::Native32RealDescriptor();
      }
      else {
        FVar6 = FArrayBox::getFormat();
        if (FVar6 != FAB_IEEE_32) goto LAB_0046a4e7;
        rd = FPC::Ieee32NormalRealDescriptor();
      }
    }
    poVar7 = operator<<(os,rd);
    uStack_38 = CONCAT17(10,(undefined7)uStack_38);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)((long)&uStack_38 + 7),1);
  }
LAB_0046a4e7:
  lVar9 = *(long *)os;
  *(uint *)(os + *(long *)(lVar9 + -0x18) + 0x18) = uVar1;
  *(long *)(os + *(long *)(lVar9 + -0x18) + 8) = (long)(int)uVar4;
  if (*(int *)(os + *(long *)(lVar9 + -0x18) + 0x20) != 0) {
    Error_host("Write of VisMF::Header failed");
  }
  return os;
}

Assistant:

std::ostream&
operator<< (std::ostream        &os,
            const VisMF::Header &hd)
{
    //
    // Up the precision for the Reals in m_min and m_max.
    // Force it to be written in scientific notation to match fParallel code.
    //
    std::ios::fmtflags oflags = os.flags();
    os.setf(std::ios::floatfield, std::ios::scientific);
    int oldPrec(os.precision(16));

    os << hd.m_vers     << '\n';
    os << int(hd.m_how) << '\n';
    os << hd.m_ncomp    << '\n';
    if (hd.m_ngrow == hd.m_ngrow[0]) {
        os << hd.m_ngrow[0] << '\n';
    } else {
        os << hd.m_ngrow    << '\n';
    }

    hd.m_ba.writeOn(os); os << '\n';

    os << hd.m_fod      << '\n';

    if(hd.m_vers == VisMF::Header::Version_v1 ||
       hd.m_vers == VisMF::Header::NoFabHeaderMinMax_v1)
    {
      os << hd.m_min      << '\n';
      os << hd.m_max      << '\n';
    }

    if(hd.m_vers == VisMF::Header::NoFabHeaderFAMinMax_v1) {
      BL_ASSERT(hd.m_famin.size() == hd.m_ncomp);
      BL_ASSERT(hd.m_famin.size() == hd.m_famax.size());
      for(int i(0); i < hd.m_famin.size(); ++i) {
        os << hd.m_famin[i] << ',';
      }
      os << '\n';
      for(int i(0); i < hd.m_famax.size(); ++i) {
        os << hd.m_famax[i] << ',';
      }
      os << '\n';
    }

    if(hd.m_vers == VisMF::Header::NoFabHeader_v1       ||
       hd.m_vers == VisMF::Header::NoFabHeaderMinMax_v1 ||
       hd.m_vers == VisMF::Header::NoFabHeaderFAMinMax_v1)
    {
      if(FArrayBox::getFormat() == FABio::FAB_NATIVE) {
        os << FPC::NativeRealDescriptor() << '\n';
      } else if(FArrayBox::getFormat() == FABio::FAB_NATIVE_32) {
        os << FPC::Native32RealDescriptor() << '\n';
      } else if(FArrayBox::getFormat() == FABio::FAB_IEEE_32) {
        os << FPC::Ieee32NormalRealDescriptor() << '\n';
      }
    }

    os.flags(oflags);
    os.precision(oldPrec);

    if( ! os.good()) {
        amrex::Error("Write of VisMF::Header failed");
    }

    return os;
}